

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

void __thiscall
phpconvert::ZendParser::generatePreparedTypeFull
          (ZendParser *this,PreparedType *outPrep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVect)

{
  StringHelper *this_00;
  bool bVar1;
  string *out;
  ZendParser *this_01;
  string tmpString;
  stringstream stream;
  string local_210;
  undefined1 local_1f0 [32];
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [12];
  
  bVar1 = hasDelimeter(this,outPrep);
  if (bVar1) {
    std::operator+(local_1b0,"\\",&outPrep->type);
    std::__cxx11::string::operator=((string *)&outPrep->alias,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    local_1f0._0_8_ = local_1f0 + 0x10;
    local_1f0._8_8_ = (pointer)0x0;
    local_1f0[0x10] = '\0';
    this_00 = this->stringHelper;
    std::__cxx11::string::string((string *)&local_210,"_",(allocator *)&local_1d0);
    StringHelper::split(this_00,tmpVect,&local_210,&outPrep->type);
    std::__cxx11::string::~string((string *)&local_210);
    this_01 = (ZendParser *)local_1f0;
    std::__cxx11::string::_M_assign((string *)this_01);
    toLower(this_01,(string *)local_1f0);
    bVar1 = isKeyword(this,(string *)local_1f0);
    extractNamespace(this,&outPrep->type,(string *)local_1f0,tmpVect);
    generateAlias(&local_1d0,this,&outPrep->type,bVar1 + 1,tmpVect);
    std::operator+(&local_210,"_",&local_1d0);
    std::__cxx11::string::append((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1d0);
    out = &outPrep->alias;
    generateNamespace(this,(string *)local_1f0,out);
    std::operator+(&local_210,"\\",out);
    std::__cxx11::string::operator=((string *)out,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypeFull(PreparedType &outPrep,
                                              vector<string> &tmpVect) {
        if (hasDelimeter(outPrep)) {
            outPrep.alias = NAMESPACE_SEPARATOR + outPrep.type; //extract const - ns sep.
            return;
        }

        stringstream stream;
        string tmpString;
        size_t size = 1;

        this->stringHelper->split(tmpVect, DELIMETER, outPrep.type);

        tmpString = tmpVect[tmpVect.size() - 1];
        toLower(tmpString);

        if (isKeyword(tmpString)) {
            size = 2;
        }

        extractNamespace(outPrep.type, tmpString, tmpVect);
        tmpString += DELIMETER + generateAlias(outPrep.type, size, tmpVect);
        generateNamespace(tmpString, outPrep.alias);

        outPrep.alias = NAMESPACE_SEPARATOR + outPrep.alias;
    }